

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Control.cpp
# Opt level: O1

void __thiscall Control::loop(undefined8 param_1,GameData *Data,int param_3)

{
  pointer pcVar1;
  undefined3 uVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  GameData *pGVar6;
  GameData *pGVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  Draw local_b5;
  uint local_b4;
  uint local_b0;
  GameOperator local_ac;
  undefined1 local_a8 [80];
  _Alloc_hider local_58;
  char local_48 [16];
  int local_38;
  
  bVar10 = 0;
  local_ac.statusNum = param_3;
  GameData::InitNewGame(Data);
  local_b0 = 0;
  local_b4 = 0;
  do {
    pGVar6 = Data;
    pGVar7 = (GameData *)local_a8;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      uVar2 = *(undefined3 *)&pGVar6->field_0x1;
      iVar4 = *(int *)((long)(pGVar6->num + 0) + 0);
      pGVar7->IsMove = pGVar6->IsMove;
      *(undefined3 *)&pGVar7->field_0x1 = uVar2;
      *(int *)((long)(pGVar7->num + 0) + 0) = iVar4;
      pGVar6 = (GameData *)((long)pGVar6 + (ulong)bVar10 * -0x10 + 8);
      pGVar7 = (GameData *)((long)pGVar7 + (ulong)bVar10 * -0x10 + 8);
    }
    local_a8._72_4_ = Data->my_best;
    pcVar1 = (Data->local_name)._M_dataplus._M_p;
    local_58._M_p = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,pcVar1 + (Data->local_name)._M_string_length);
    local_38 = Data->local_best;
    uVar8 = local_b4 & 0xff;
    uVar9 = local_b0 & 0xff;
    Draw::PrintUi(&local_b5,(GameData *)local_a8,(bool)((byte)local_b4 & 1),
                  (bool)((byte)local_b0 & 1));
    if (local_58._M_p != local_48) {
      operator_delete(local_58._M_p);
    }
    iVar4 = GameOperator::GetMoveNumber(&local_ac);
    if ((local_b0 & 1) == 0) {
      if ((local_b4 & 1) == 0) {
        if (iVar4 == 5) {
          uVar8 = 1;
        }
        if (iVar4 - 8U < 0xfffffffd) {
          GameOperator::Move(&local_ac,Data,iVar4);
          bVar3 = GameData::IsGameOver(Data);
          if (bVar3) {
            uVar9 = 1;
          }
          local_b0 = uVar9;
          if (Data->IsMove == true) {
            GameData::MakeNewNumber(Data);
          }
        }
      }
      else {
        while (iVar4 - 8U < 0xfffffffe) {
          iVar4 = GameOperator::GetMoveNumber(&local_ac);
        }
        uVar8 = 0;
        bVar3 = false;
        if (iVar4 == 6) goto LAB_001025ca;
      }
LAB_001025b9:
      Draw::ClearScreen(&local_b5);
      bVar3 = true;
      local_b4 = uVar8;
    }
    else {
      while (iVar4 - 8U < 0xfffffffe) {
        iVar4 = GameOperator::GetMoveNumber(&local_ac);
      }
      if (iVar4 == 6) {
        GameData::InitNewGame(Data);
        local_b0 = 0;
        uVar8 = local_b4;
        goto LAB_001025b9;
      }
      bVar3 = false;
    }
LAB_001025ca:
    if (!bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void Control::loop(GameData Data, Draw DrawUi, GameOperator Operator) {
    bool flagQuit = false;
    bool flagGameOver = false;
    Data.InitNewGame();
    while (true) {
        DrawUi.PrintUi(Data, flagQuit, flagGameOver);

        int Tempop;
        if (flagGameOver) {
            Tempop = Operator.GetMoveNumber();
            while (Tempop != YES && Tempop != NO)
                Tempop = Operator.GetMoveNumber();
            if (Tempop == YES) {
                Data.InitNewGame();
                flagGameOver = false;
            } else
                break;
        }

        else if (flagQuit) {
            Tempop = Operator.GetMoveNumber();
            while (Tempop != YES && Tempop != NO)
                Tempop = Operator.GetMoveNumber();
            if (Tempop == YES)
                break;
            else
                flagQuit = false;
        }

        else
        {
            Tempop = Operator.GetMoveNumber();

            if (Tempop == QUIT)
                flagQuit = true;

            if (Tempop != NO && Tempop != YES && Tempop != QUIT) {
                Operator.Move(Data, Tempop);
                if (Data.IsGameOver())
                    flagGameOver = true;
                if(Data.IsMove)
                    Data.MakeNewNumber();
            }
        }

        DrawUi.ClearScreen();
    }
}